

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int expbuf_write(expbuf_t *buf,int fd)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  size_t *psVar5;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar6;
  size_t bufsz;
  long local_50;
  iovec local_48;
  expbuf_t *local_38;
  long local_30;
  
  local_50 = CONCAT44(in_register_00000034,fd) - (long)buf;
  local_48.iov_base = &local_50;
  local_48.iov_len = 8;
  lVar4 = 0;
  lVar6 = 0;
  local_38 = buf;
  local_30 = local_50;
  do {
    while (uVar2 = writev(in_EDX,&local_48 + lVar4,2 - (int)lVar6), uVar2 == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        return -1;
      }
    }
    if (uVar2 == 0) {
      __assert_fail("r != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/neverbleed/neverbleed.c"
                    ,0xfc,"int expbuf_write(struct expbuf_t *, int)");
    }
    lVar6 = (long)(int)lVar6;
    psVar5 = &(&local_48)[lVar6].iov_len;
    do {
      uVar1 = *psVar5;
      if (uVar2 < uVar1) {
        ((iovec *)(psVar5 + -1))->iov_base =
             (void *)((long)((iovec *)(psVar5 + -1))->iov_base + uVar2);
        *psVar5 = uVar1 - uVar2;
        break;
      }
      lVar6 = lVar6 + 1;
      psVar5 = psVar5 + 2;
      uVar2 = uVar2 - uVar1;
    } while (uVar2 != 0);
    lVar4 = (long)(int)lVar6;
    if ((int)lVar6 == 2) {
      return 0;
    }
  } while( true );
}

Assistant:

static int expbuf_write(struct expbuf_t *buf, int fd)
{
    struct iovec vecs[2] = {{NULL}};
    size_t bufsz = expbuf_size(buf);
    int vecindex;
    ssize_t r;

    vecs[0].iov_base = &bufsz;
    vecs[0].iov_len = sizeof(bufsz);
    vecs[1].iov_base = buf->start;
    vecs[1].iov_len = bufsz;

    for (vecindex = 0; vecindex != sizeof(vecs) / sizeof(vecs[0]);) {
        while ((r = writev(fd, vecs + vecindex, sizeof(vecs) / sizeof(vecs[0]) - vecindex)) == -1 && errno == EINTR)
            ;
        if (r == -1)
            return -1;
        assert(r != 0);
        while (r != 0 && r >= vecs[vecindex].iov_len) {
            r -= vecs[vecindex].iov_len;
            ++vecindex;
        }
        if (r != 0) {
            vecs[vecindex].iov_base = (char *)vecs[vecindex].iov_base + r;
            vecs[vecindex].iov_len -= r;
        }
    }

    return 0;
}